

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O1

Token * __thiscall slang::syntax::SyntaxNode::getLastTokenPtr(SyntaxNode *this)

{
  size_t sVar1;
  variant_alternative_t<1UL,_variant<Token_*,_SyntaxNode_*>_> *ppSVar2;
  Token *pTVar3;
  variant_alternative_t<0UL,_variant<Token_*,_SyntaxNode_*>_> *ppTVar4;
  PtrGetChildVisitor *in_RCX;
  undefined1 extraout_DL;
  char extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 uVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 uVar6;
  unsigned_long *in_R8;
  Token *unaff_R12;
  PtrTokenOrSyntax *local_30 [2];
  
  sVar1 = getChildCount(this);
  uVar5 = extraout_DL;
  uVar6 = extraout_var;
  do {
    if ((long)sVar1 < 1) {
      return (Token *)0x0;
    }
    sVar1 = sVar1 - 1;
    local_30[0] = (PtrTokenOrSyntax *)sVar1;
    local_30[0] = detail::
                  visitSyntaxNode<slang::syntax::SyntaxNode,(anonymous_namespace)::PtrGetChildVisitor,unsigned_long&>
                            ((PtrTokenOrSyntax *)this,(detail *)local_30,
                             (SyntaxNode *)CONCAT71(uVar6,uVar5),in_RCX,in_R8);
    if (extraout_DL_00 == '\0') {
      ppTVar4 = std::get<0ul,slang::parsing::Token*,slang::syntax::SyntaxNode*>
                          ((variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> *)local_30
                          );
      uVar5 = extraout_DL_03;
      uVar6 = extraout_var_02;
      if (*ppTVar4 == (variant_alternative_t<0UL,_variant<Token_*,_SyntaxNode_*>_>)0x0)
      goto LAB_006b1fea;
      ppTVar4 = std::get<0ul,slang::parsing::Token*,slang::syntax::SyntaxNode*>
                          ((variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> *)local_30
                          );
      in_RCX = (PtrGetChildVisitor *)0x0;
      uVar5 = extraout_DL_04;
      uVar6 = extraout_var_03;
      unaff_R12 = *ppTVar4;
    }
    else {
      ppSVar2 = std::get<1ul,slang::parsing::Token*,slang::syntax::SyntaxNode*>
                          ((variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> *)local_30
                          );
      uVar5 = extraout_DL_01;
      uVar6 = extraout_var_00;
      if (*ppSVar2 == (variant_alternative_t<1UL,_variant<Token_*,_SyntaxNode_*>_>)0x0) {
LAB_006b1fea:
        in_RCX = (PtrGetChildVisitor *)CONCAT71((int7)((ulong)in_RCX >> 8),1);
      }
      else {
        ppSVar2 = std::get<1ul,slang::parsing::Token*,slang::syntax::SyntaxNode*>
                            ((variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> *)
                             local_30);
        pTVar3 = getLastTokenPtr(*ppSVar2);
        in_RCX = (PtrGetChildVisitor *)CONCAT71((int7)((ulong)in_RCX >> 8),pTVar3 == (Token *)0x0);
        uVar5 = extraout_DL_02;
        uVar6 = extraout_var_01;
        if (pTVar3 != (Token *)0x0) {
          unaff_R12 = pTVar3;
        }
      }
    }
    if ((char)in_RCX == '\0') {
      return unaff_R12;
    }
  } while( true );
}

Assistant:

parsing::Token* SyntaxNode::getLastTokenPtr() {
    size_t childCount = getChildCount();
    for (ptrdiff_t i = ptrdiff_t(childCount) - 1; i >= 0; i--) {
        auto child = getChildPtr(size_t(i));
        if (child.isToken()) {
            if (child.token())
                return child.token();
        }
        else if (child.node()) {
            auto result = child.node()->getLastTokenPtr();
            if (result)
                return result;
        }
    }
    return nullptr;
}